

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O1

bool __thiscall RichHdrWrapper::wrap(RichHdrWrapper *this)

{
  RICH_SIGNATURE *pRVar1;
  RICH_DANS_HEADER *pRVar2;
  ulong uVar3;
  
  pRVar1 = PEFile::getRichHeaderSign((this->super_PEElementWrapper).m_PE);
  this->richSign = pRVar1;
  pRVar2 = PEFile::getRichHeaderBgn((this->super_PEElementWrapper).m_PE,pRVar1);
  this->dansHdr = pRVar2;
  pRVar1 = this->richSign;
  uVar3 = 0;
  if (pRVar2 != (RICH_DANS_HEADER *)0x0 && pRVar1 != (RICH_SIGNATURE *)0x0) {
    uVar3 = (ulong)((long)pRVar1 + (-0x10 - (long)pRVar2)) >> 3;
  }
  this->compIdCounter = uVar3;
  return pRVar2 != (RICH_DANS_HEADER *)0x0 && pRVar1 != (RICH_SIGNATURE *)0x0;
}

Assistant:

bool RichHdrWrapper::wrap()
{
    this->richSign = m_PE->getRichHeaderSign();
    this->dansHdr = m_PE->getRichHeaderBgn(richSign);
    if (!this->richSign || !this->dansHdr) {
        this->compIdCounter = 0;
        return false;
    }
    this->compIdCounter = this->compIdCount();
    return true;
}